

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QGridLayoutItem_*>::copyAppend
          (QPodArrayOps<QGridLayoutItem_*> *this,qsizetype n,parameter_type t)

{
  long lVar1;
  QGridLayoutItem **ppQVar2;
  long lVar3;
  
  if (n != 0) {
    lVar1 = (this->super_QArrayDataPointer<QGridLayoutItem_*>).size;
    ppQVar2 = (this->super_QArrayDataPointer<QGridLayoutItem_*>).ptr;
    (this->super_QArrayDataPointer<QGridLayoutItem_*>).size = lVar1 + n;
    for (lVar3 = 0; n != lVar3; lVar3 = lVar3 + 1) {
      ppQVar2[lVar1 + lVar3] = t;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t) noexcept
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *where = this->end();
        this->size += qsizetype(n);
        while (n--)
            *where++ = t;
    }